

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<127UL> * __thiscall GF2::WW<127UL>::Permute(WW<127UL> *this,size_t *pi)

{
  bool bVar1;
  WW<127UL> *pWVar2;
  long in_RSI;
  WW<127UL> *in_RDI;
  size_t pos;
  WW<127UL> temp;
  ulong local_28;
  WW<127UL> local_20;
  long local_10;
  
  local_10 = in_RSI;
  WW((WW<127UL> *)0x176392);
  for (local_28 = 0; local_28 < 0x7f; local_28 = local_28 + 1) {
    if (*(long *)(local_10 + local_28 * 8) == -1) {
      bVar1 = false;
    }
    else {
      bVar1 = Test(in_RDI,*(size_t *)(local_10 + local_28 * 8));
    }
    Set(&local_20,local_28,bVar1 != false);
  }
  pWVar2 = operator=(in_RDI,&local_20);
  return pWVar2;
}

Assistant:

WW& Permute(const size_t pi[_n])
	{	
		WW<_n> temp;
		for (size_t pos = 0; pos < _n; ++pos)
			temp.Set(pos, pi[pos] == SIZE_MAX ? 0 : Test(pi[pos]));
		return operator=(temp);
	}